

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsymmetricAlgorithm.cpp
# Opt level: O0

bool __thiscall AsymmetricAlgorithm::signFinal(AsymmetricAlgorithm *this,ByteString *param_1)

{
  bool bVar1;
  ByteString *param_1_local;
  AsymmetricAlgorithm *this_local;
  
  bVar1 = this->currentOperation == SIGN;
  if (bVar1) {
    this->currentOperation = NONE;
    this->currentPrivateKey = (PrivateKey *)0x0;
    this->currentMechanism = Unknown;
  }
  return bVar1;
}

Assistant:

bool AsymmetricAlgorithm::signFinal(ByteString& /*signature*/)
{
	if (currentOperation != SIGN)
	{
		return false;
	}

	currentOperation = NONE;
	currentPrivateKey = NULL;
	currentMechanism = AsymMech::Unknown;

	return true;
}